

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.cc
# Opt level: O0

int DSA_do_check_signature(int *out_valid,uint8_t *digest,size_t digest_len,DSA_SIG *sig,DSA *dsa)

{
  int iVar1;
  uint uVar2;
  BN_CTX *bn_ctx;
  BN_MONT_CTX *pBVar3;
  BIGNUM *pBVar4;
  uint q_bits;
  BN_CTX *ctx;
  BIGNUM t1;
  BIGNUM u2;
  BIGNUM u1;
  int ret;
  DSA *dsa_local;
  DSA_SIG *sig_local;
  size_t digest_len_local;
  uint8_t *digest_local;
  int *out_valid_local;
  
  *out_valid = 0;
  iVar1 = dsa_check_key(dsa);
  if (iVar1 == 0) {
    out_valid_local._4_4_ = 0;
  }
  else if (dsa->pub_key == (BIGNUM *)0x0) {
    ERR_put_error(10,0,0x65,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dsa/dsa.cc"
                  ,0x28f);
    out_valid_local._4_4_ = 0;
  }
  else {
    u1.flags = 0;
    BN_init((BIGNUM *)&u2.neg);
    BN_init((BIGNUM *)&t1.neg);
    BN_init((BIGNUM *)&ctx);
    bn_ctx = (BN_CTX *)BN_CTX_new();
    if (bn_ctx != (BN_CTX *)0x0) {
      iVar1 = BN_is_zero(sig->r);
      if (((iVar1 == 0) && (iVar1 = BN_is_negative(sig->r), iVar1 == 0)) &&
         (iVar1 = BN_ucmp((BIGNUM *)sig->r,(BIGNUM *)dsa->q), iVar1 < 0)) {
        iVar1 = BN_is_zero(sig->s);
        if (((iVar1 == 0) && (iVar1 = BN_is_negative(sig->s), iVar1 == 0)) &&
           (iVar1 = BN_ucmp((BIGNUM *)sig->s,(BIGNUM *)dsa->q), iVar1 < 0)) {
          pBVar3 = BN_MONT_CTX_set_locked(&dsa->method_mont_p,&dsa->method_mont_lock,dsa->p,bn_ctx);
          if ((((int)pBVar3 != 0) &&
              (pBVar3 = BN_MONT_CTX_set_locked
                                  (&dsa->method_mont_q,&dsa->method_mont_lock,dsa->q,bn_ctx),
              (int)pBVar3 != 0)) &&
             ((iVar1 = BN_from_montgomery((BIGNUM *)&t1.neg,(BIGNUM *)sig->s,
                                          (BN_MONT_CTX *)dsa->method_mont_q,(BN_CTX *)bn_ctx),
              iVar1 != 0 &&
              (pBVar4 = BN_mod_inverse((BIGNUM *)&t1.neg,(BIGNUM *)&t1.neg,(BIGNUM *)dsa->q,
                                       (BN_CTX *)bn_ctx), pBVar4 != (BIGNUM *)0x0)))) {
            uVar2 = BN_num_bits((BIGNUM *)dsa->q);
            sig_local = (DSA_SIG *)digest_len;
            if (uVar2 >> 3 < digest_len) {
              sig_local = (DSA_SIG *)(ulong)(uVar2 >> 3);
            }
            pBVar4 = BN_bin2bn(digest,(int)sig_local,(BIGNUM *)&u2.neg);
            if ((((pBVar4 != (BIGNUM *)0x0) &&
                 (iVar1 = BN_mod_mul_montgomery
                                    ((BIGNUM *)&u2.neg,(BIGNUM *)&u2.neg,(BIGNUM *)&t1.neg,
                                     (BN_MONT_CTX *)dsa->method_mont_q,(BN_CTX *)bn_ctx), iVar1 != 0
                 )) && (iVar1 = BN_mod_mul_montgomery
                                          ((BIGNUM *)&t1.neg,(BIGNUM *)sig->r,(BIGNUM *)&t1.neg,
                                           (BN_MONT_CTX *)dsa->method_mont_q,(BN_CTX *)bn_ctx),
                       iVar1 != 0)) &&
               ((iVar1 = BN_mod_exp2_mont((BIGNUM *)&ctx,(BIGNUM *)dsa->g,(BIGNUM *)&u2.neg,
                                          (BIGNUM *)dsa->pub_key,(BIGNUM *)&t1.neg,(BIGNUM *)dsa->p,
                                          (BN_CTX *)bn_ctx,(BN_MONT_CTX *)dsa->method_mont_p),
                iVar1 != 0 &&
                (iVar1 = BN_div((BIGNUM *)0x0,(BIGNUM *)&u2.neg,(BIGNUM *)&ctx,(BIGNUM *)dsa->q,
                                (BN_CTX *)bn_ctx), iVar1 != 0)))) {
              iVar1 = BN_ucmp((BIGNUM *)&u2.neg,(BIGNUM *)sig->r);
              *out_valid = (uint)(iVar1 == 0);
              u1.flags = 1;
            }
          }
        }
        else {
          u1.flags = 1;
        }
      }
      else {
        u1.flags = 1;
      }
    }
    if (u1.flags != 1) {
      ERR_put_error(10,0,3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dsa/dsa.cc"
                    ,0x2e5);
    }
    BN_CTX_free((BN_CTX *)bn_ctx);
    BN_free((BIGNUM *)&u2.neg);
    BN_free((BIGNUM *)&t1.neg);
    BN_free((BIGNUM *)&ctx);
    out_valid_local._4_4_ = u1.flags;
  }
  return out_valid_local._4_4_;
}

Assistant:

int DSA_do_check_signature(int *out_valid, const uint8_t *digest,
                           size_t digest_len, const DSA_SIG *sig,
                           const DSA *dsa) {
  *out_valid = 0;
  if (!dsa_check_key(dsa)) {
    return 0;
  }

  if (dsa->pub_key == NULL) {
    OPENSSL_PUT_ERROR(DSA, DSA_R_MISSING_PARAMETERS);
    return 0;
  }

  int ret = 0;
  BIGNUM u1, u2, t1;
  BN_init(&u1);
  BN_init(&u2);
  BN_init(&t1);
  BN_CTX *ctx = BN_CTX_new();
  {
    if (ctx == NULL) {
      goto err;
    }

    if (BN_is_zero(sig->r) || BN_is_negative(sig->r) ||
        BN_ucmp(sig->r, dsa->q) >= 0) {
      ret = 1;
      goto err;
    }
    if (BN_is_zero(sig->s) || BN_is_negative(sig->s) ||
        BN_ucmp(sig->s, dsa->q) >= 0) {
      ret = 1;
      goto err;
    }

    if (!BN_MONT_CTX_set_locked((BN_MONT_CTX **)&dsa->method_mont_p,
                                (CRYPTO_MUTEX *)&dsa->method_mont_lock, dsa->p,
                                ctx) ||
        !BN_MONT_CTX_set_locked((BN_MONT_CTX **)&dsa->method_mont_q,
                                (CRYPTO_MUTEX *)&dsa->method_mont_lock, dsa->q,
                                ctx)) {
      goto err;
    }

    // Calculate W = inv(S) mod Q, in the Montgomery domain. This is slightly
    // more efficiently computed as FromMont(s)^-1 = (s * R^-1)^-1 = s^-1 * R,
    // instead of ToMont(s^-1) = s^-1 * R.
    if (!BN_from_montgomery(&u2, sig->s, dsa->method_mont_q, ctx) ||
        !BN_mod_inverse(&u2, &u2, dsa->q, ctx)) {
      goto err;
    }

    // save M in u1
    unsigned q_bits = BN_num_bits(dsa->q);
    if (digest_len > (q_bits >> 3)) {
      // if the digest length is greater than the size of q use the
      // BN_num_bits(dsa->q) leftmost bits of the digest, see
      // fips 186-3, 4.2
      digest_len = (q_bits >> 3);
    }

    if (BN_bin2bn(digest, digest_len, &u1) == NULL) {
      goto err;
    }

    // u1 = M * w mod q. w was stored in the Montgomery domain while M was not,
    // so the result will already be out of the Montgomery domain.
    if (!BN_mod_mul_montgomery(&u1, &u1, &u2, dsa->method_mont_q, ctx)) {
      goto err;
    }

    // u2 = r * w mod q. w was stored in the Montgomery domain while r was not,
    // so the result will already be out of the Montgomery domain.
    if (!BN_mod_mul_montgomery(&u2, sig->r, &u2, dsa->method_mont_q, ctx)) {
      goto err;
    }

    if (!BN_mod_exp2_mont(&t1, dsa->g, &u1, dsa->pub_key, &u2, dsa->p, ctx,
                          dsa->method_mont_p)) {
      goto err;
    }

    // let u1 = u1 mod q
    if (!BN_mod(&u1, &t1, dsa->q, ctx)) {
      goto err;
    }

    // V is now in u1.  If the signature is correct, it will be
    // equal to R.
    *out_valid = BN_ucmp(&u1, sig->r) == 0;
    ret = 1;
  }

err:
  if (ret != 1) {
    OPENSSL_PUT_ERROR(DSA, ERR_R_BN_LIB);
  }
  BN_CTX_free(ctx);
  BN_free(&u1);
  BN_free(&u2);
  BN_free(&t1);

  return ret;
}